

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrdp.cpp
# Opt level: O0

void __thiscall pg::RRDPSolver::run(RRDPSolver *this)

{
  pointer piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  int *piVar16;
  long lVar17;
  void *this_00;
  uint *puVar18;
  reference piVar19;
  vector<int,_std::allocator<int>_> *this_01;
  ostream *poVar20;
  vector<int,_std::allocator<int>_> *pvVar21;
  ulong uVar22;
  _label_vertex _Var23;
  int local_1e0;
  int local_1dc;
  uint local_18c;
  int local_174;
  vector<int,_std::allocator<int>_> *local_158;
  int local_134;
  int i_8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_128;
  const_iterator local_120;
  int *local_118;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_110;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_108;
  const_iterator local_100;
  int local_f4;
  iterator iStack_f0;
  int i_7;
  iterator __end7;
  iterator __begin7;
  vector<int,_std::allocator<int>_> *__range7;
  _label_vertex local_c8;
  int local_b4;
  iterator iStack_b0;
  int n;
  iterator __end8;
  iterator __begin8;
  vector<int,_std::allocator<int>_> *__range8;
  int i_6;
  int l;
  iterator __end6;
  iterator __begin6;
  vector<int,_std::allocator<int>_> *__range6;
  int local_70;
  uint uStack_6c;
  bool locked;
  int j;
  int res;
  int i_5;
  int i_4;
  int max;
  uint local_50;
  int local_4c;
  int p;
  int discarded;
  int del1;
  int del0;
  vector<int,_std::allocator<int>_> P;
  uint local_20;
  int performances;
  int i;
  int i_3;
  int i_2;
  int i_1;
  RRDPSolver *this_local;
  
  lVar12 = Solver::nodecount((Solver *)this);
  iVar9 = Solver::priority((Solver *)this,(int)lVar12 + -1);
  (this->super_RRSolver).super_PPSolver.max_prio = iVar9;
  uVar13 = (ulong)((this->super_RRSolver).super_PPSolver.max_prio + 1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar13;
  uVar14 = SUB168(auVar2 * ZEXT816(0x18),0);
  uVar22 = uVar14 + 8;
  if (SUB168(auVar2 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar14) {
    uVar22 = 0xffffffffffffffff;
  }
  puVar15 = (ulong *)operator_new__(uVar22);
  *puVar15 = uVar13;
  pvVar21 = (vector<int,_std::allocator<int>_> *)(puVar15 + 1);
  if (uVar13 != 0) {
    local_158 = pvVar21;
    do {
      std::vector<int,_std::allocator<int>_>::vector(local_158);
      local_158 = local_158 + 1;
    } while (local_158 != pvVar21 + uVar13);
  }
  (this->super_RRSolver).super_PPSolver.regions = pvVar21;
  uVar13 = Solver::nodecount((Solver *)this);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar13;
  uVar13 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  piVar16 = (int *)operator_new__(uVar13);
  (this->super_RRSolver).super_PPSolver.region = piVar16;
  uVar13 = Solver::nodecount((Solver *)this);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar13;
  uVar13 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  piVar16 = (int *)operator_new__(uVar13);
  this->region_ = piVar16;
  uVar13 = Solver::nodecount((Solver *)this);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar13;
  uVar13 = SUB168(auVar5 * ZEXT816(4),0);
  if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  piVar16 = (int *)operator_new__(uVar13);
  (this->super_RRSolver).super_PPSolver.strategy = piVar16;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)((this->super_RRSolver).super_PPSolver.max_prio + 1);
  uVar13 = SUB168(auVar6 * ZEXT816(4),0);
  if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  piVar16 = (int *)operator_new__(uVar13);
  (this->super_RRSolver).super_PPSolver.inverse = piVar16;
  for (i_3 = 0; lVar12 = Solver::nodecount((Solver *)this), i_3 < lVar12; i_3 = i_3 + 1) {
    bVar7 = bitset::operator[]((this->super_RRSolver).super_PPSolver.super_Solver.disabled,(long)i_3
                              );
    if (bVar7) {
      local_174 = -2;
    }
    else {
      local_174 = Solver::priority((Solver *)this,i_3);
    }
    (this->super_RRSolver).super_PPSolver.region[i_3] = local_174;
  }
  for (i = 0; lVar12 = Solver::nodecount((Solver *)this), i < lVar12; i = i + 1) {
    this->region_[i] = -1;
  }
  for (performances = 0; lVar12 = Solver::nodecount((Solver *)this), performances < lVar12;
      performances = performances + 1) {
    (this->super_RRSolver).super_PPSolver.strategy[performances] = -1;
  }
  lVar12 = Solver::nodecount((Solver *)this);
  local_20 = (int)lVar12 - 1;
  (this->super_RRSolver).super_PPSolver.promotions = 0;
  P.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage.
  _4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&del1);
  discarded = 0;
  p = 0;
  local_4c = 0;
LAB_001fd3d4:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          if ((int)local_20 < 0) {
            local_18c = 0xffffffff;
          }
          else {
            local_18c = Solver::priority((Solver *)this,local_20);
          }
          local_50 = local_18c;
          while( true ) {
            bVar7 = false;
            if (-1 < (int)local_20) {
              uVar10 = Solver::priority((Solver *)this,local_20);
              bVar7 = false;
              if (uVar10 == local_50) {
                bVar8 = bitset::operator[]((this->super_RRSolver).super_PPSolver.super_Solver.
                                           disabled,(long)(int)local_20);
                bVar7 = true;
                if (!bVar8) {
                  bVar7 = (int)local_50 <
                          (this->super_RRSolver).super_PPSolver.region[(int)local_20];
                }
              }
            }
            if (!bVar7) break;
            local_20 = local_20 - 1;
          }
          if (-1 < (int)local_20) break;
          i_5 = -1;
          for (res = 0; lVar12 = (long)res, lVar17 = Solver::nodecount((Solver *)this),
              lVar12 < lVar17; res = res + 1) {
            if (i_5 < this->region_[res]) {
              i_5 = this->region_[res];
            }
          }
          if (i_5 == -1) {
            pvVar21 = (this->super_RRSolver).super_PPSolver.regions;
            if (pvVar21 != (vector<int,_std::allocator<int>_> *)0x0) {
              piVar1 = pvVar21[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              this_01 = pvVar21 + (long)piVar1;
              while (pvVar21 != this_01) {
                this_01 = this_01 + -1;
                std::vector<int,_std::allocator<int>_>::~vector(this_01);
              }
              operator_delete__(&pvVar21[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,(long)piVar1 * 0x18 + 8);
            }
            piVar16 = (this->super_RRSolver).super_PPSolver.region;
            if (piVar16 != (int *)0x0) {
              operator_delete__(piVar16);
            }
            if (this->region_ != (int *)0x0) {
              operator_delete__(this->region_);
            }
            piVar16 = (this->super_RRSolver).super_PPSolver.strategy;
            if (piVar16 != (int *)0x0) {
              operator_delete__(piVar16);
            }
            piVar16 = (this->super_RRSolver).super_PPSolver.inverse;
            if (piVar16 != (int *)0x0) {
              operator_delete__(piVar16);
            }
            poVar20 = std::operator<<((this->super_RRSolver).super_PPSolver.super_Solver.logger,
                                      "solved with ");
            poVar20 = (ostream *)
                      std::ostream::operator<<
                                (poVar20,(this->super_RRSolver).super_PPSolver.promotions);
            poVar20 = std::operator<<(poVar20," promotions, ");
            poVar20 = (ostream *)
                      std::ostream::operator<<
                                (poVar20,P.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_end_of_storage._4_4_);
            poVar20 = std::operator<<(poVar20,"x performing delayed promotions (delayed ");
            poVar20 = (ostream *)std::ostream::operator<<(poVar20,this->delayed);
            poVar20 = std::operator<<(poVar20,", discarded ");
            poVar20 = (ostream *)std::ostream::operator<<(poVar20,local_4c);
            poVar20 = std::operator<<(poVar20,", total ");
            poVar20 = (ostream *)
                      std::ostream::operator<<
                                (poVar20,(this->super_RRSolver).super_PPSolver.promotions + local_4c
                                );
            poVar20 = std::operator<<(poVar20,")");
            std::ostream::operator<<(poVar20,std::endl<char,std::char_traits<char>>);
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)&del1);
            return;
          }
          if ((this->super_RRSolver).super_PPSolver.super_Solver.trace != 0) {
            poVar20 = std::operator<<((this->super_RRSolver).super_PPSolver.super_Solver.logger,
                                      "performing delayed promotions of player ");
            this_00 = (void *)std::ostream::operator<<(poVar20,i_5 & 1);
            std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          }
          P.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ =
               P.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._4_4_ + 1;
          for (j = 0; lVar12 = (long)j, lVar17 = Solver::nodecount((Solver *)this), lVar12 < lVar17;
              j = j + 1) {
            if (((this->super_RRSolver).super_PPSolver.region[j] != -2) && (this->region_[j] != -1))
            {
              if (((this->super_RRSolver).super_PPSolver.region[j] & 1U) == (i_5 & 1U)) {
                (this->super_RRSolver).super_PPSolver.region[j] = this->region_[j];
                std::vector<int,_std::allocator<int>_>::push_back
                          ((this->super_RRSolver).super_PPSolver.regions +
                           (this->super_RRSolver).super_PPSolver.region[j],&j);
              }
              this->region_[j] = -1;
            }
          }
          std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)&del1);
          if ((this->super_RRSolver).super_PPSolver.super_Solver.trace != 0) {
            poVar20 = std::operator<<((this->super_RRSolver).super_PPSolver.super_Solver.logger,
                                      "finished performing delayed promotions");
            std::ostream::operator<<(poVar20,std::endl<char,std::char_traits<char>>);
          }
          local_20 = (this->super_RRSolver).super_PPSolver.inverse[i_5];
          if ((i_5 & 1U) == 0) {
            local_1dc = discarded;
          }
          else {
            local_1dc = p;
          }
          (this->super_RRSolver).super_PPSolver.promotions =
               local_1dc + (this->super_RRSolver).super_PPSolver.promotions;
          if ((i_5 & 1U) == 0) {
            local_1e0 = p;
          }
          else {
            local_1e0 = discarded;
          }
          local_4c = local_1e0 + local_4c;
          p = 0;
          discarded = 0;
        }
        uVar10 = Solver::priority((Solver *)this,local_20);
        if (uVar10 == local_50) break;
        bVar7 = std::vector<int,_std::allocator<int>_>::empty
                          ((this->super_RRSolver).super_PPSolver.regions + (int)local_50);
        if (!bVar7) {
          PPSolver::resetRegion((PPSolver *)this,local_50);
        }
      }
      (this->super_RRSolver).super_PPSolver.inverse[(int)local_50] = local_20;
      iVar9 = Solver::priority((Solver *)this,local_20);
      iVar11 = (*(this->super_RRSolver).super_PPSolver.super_Solver._vptr_Solver[5])
                         (this,(ulong)local_50);
      bVar7 = PPSolver::setupRegion((PPSolver *)this,local_20,iVar9,(bool)(~(byte)iVar11 & 1));
      if (bVar7) break;
      while( true ) {
        bVar7 = false;
        if (-1 < (int)local_20) {
          uVar10 = Solver::priority((Solver *)this,local_20);
          bVar7 = uVar10 == local_50;
        }
        if (!bVar7) break;
        local_20 = local_20 - 1;
      }
    }
    while( true ) {
      if (1 < (this->super_RRSolver).super_PPSolver.super_Solver.trace) {
        PPSolver::reportRegion((PPSolver *)this,local_50);
      }
      uStack_6c = (*(this->super_RRSolver).super_PPSolver.super_Solver._vptr_Solver[4])
                            (this,(ulong)local_20,(ulong)local_50);
      if (uStack_6c == 0xfffffffe) goto LAB_001fd8d9;
      if (uStack_6c == 0xffffffff) break;
      bVar7 = false;
      __end6 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)&del1);
      _i_6 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)&del1)
      ;
      while (bVar8 = __gnu_cxx::operator!=
                               (&__end6,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                         *)&i_6), bVar8) {
        puVar18 = (uint *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator*(&__end6);
        if (((*puVar18 & 1) != (uStack_6c & 1)) && ((int)*puVar18 < (int)uStack_6c)) {
          bVar7 = true;
          break;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end6);
      }
      if (!bVar7) {
        for (__range8._0_4_ = 0; lVar12 = Solver::nodecount((Solver *)this), (int)__range8 < lVar12;
            __range8._0_4_ = (int)__range8 + 1) {
          bVar8 = bitset::operator[]((this->super_RRSolver).super_PPSolver.super_Solver.disabled,
                                     (long)(int)__range8);
          if (((!bVar8) &&
              ((this->super_RRSolver).super_PPSolver.region[(int)__range8] < (int)uStack_6c)) &&
             ((int)uStack_6c <= this->region_[(int)__range8])) {
            bVar7 = true;
            break;
          }
        }
      }
      if (bVar7) goto code_r0x001fdb3f;
      PPSolver::promote((PPSolver *)this,local_50,uStack_6c);
      local_110._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)&del1);
      local_118 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)&del1);
      local_108 = std::
                  remove<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                            (local_110,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                             local_118,(int *)&local_50);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_100,
                 &local_108);
      local_128._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)&del1);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_120,
                 &local_128);
      std::vector<int,_std::allocator<int>_>::erase
                ((vector<int,_std::allocator<int>_> *)&del1,local_100,local_120);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&del1,
                 (value_type_conflict *)&stack0xffffffffffffff94);
      for (local_134 = 0; lVar12 = Solver::nodecount((Solver *)this), local_134 < lVar12;
          local_134 = local_134 + 1) {
        if (((this->super_RRSolver).super_PPSolver.region[local_134] != 2) &&
           (this->region_[local_134] <= (int)uStack_6c)) {
          this->region_[local_134] = -1;
        }
      }
      local_20 = (this->super_RRSolver).super_PPSolver.inverse[(int)uStack_6c];
      local_50 = uStack_6c;
    }
    PPSolver::setDominion((PPSolver *)this,local_50);
    lVar12 = Solver::nodecount((Solver *)this);
    local_20 = (int)lVar12 - 1;
    for (local_70 = 0; lVar12 = Solver::nodecount((Solver *)this), local_70 < lVar12;
        local_70 = local_70 + 1) {
      this->region_[local_70] = -1;
    }
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)&del1);
    p = 0;
    discarded = 0;
  } while( true );
code_r0x001fdb3f:
  if ((this->super_RRSolver).super_PPSolver.super_Solver.trace < 2) {
    if ((this->super_RRSolver).super_PPSolver.super_Solver.trace != 0) {
      poVar20 = std::operator<<((this->super_RRSolver).super_PPSolver.super_Solver.logger,
                                "\x1b[1;33mdelayed \x1b[36m");
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,local_50);
      poVar20 = std::operator<<(poVar20," \x1b[37mto \x1b[36m");
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,uStack_6c);
      poVar20 = std::operator<<(poVar20,"\x1b[m");
      std::ostream::operator<<(poVar20,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar20 = std::operator<<((this->super_RRSolver).super_PPSolver.super_Solver.logger,
                              "\x1b[1;33mdelayed \x1b[36m");
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,local_50);
    poVar20 = std::operator<<(poVar20," \x1b[37mto \x1b[36m");
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,uStack_6c);
    std::operator<<(poVar20,"\x1b[m:");
    pvVar21 = (this->super_RRSolver).super_PPSolver.regions + (int)local_50;
    __end8 = std::vector<int,_std::allocator<int>_>::begin(pvVar21);
    iStack_b0 = std::vector<int,_std::allocator<int>_>::end(pvVar21);
    while (bVar7 = __gnu_cxx::operator!=(&__end8,&stack0xffffffffffffff50), bVar7) {
      piVar19 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end8);
      local_b4 = *piVar19;
      poVar20 = std::operator<<((this->super_RRSolver).super_PPSolver.super_Solver.logger,
                                " \x1b[37m");
      _Var23 = Solver::label_vertex((Solver *)this,local_b4);
      local_c8.g = _Var23.g;
      local_c8.v = _Var23.v;
      poVar20 = operator<<(poVar20,&local_c8);
      std::operator<<(poVar20,"\x1b[m");
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end8);
    }
    std::ostream::operator<<
              ((this->super_RRSolver).super_PPSolver.super_Solver.logger,
               std::endl<char,std::char_traits<char>>);
  }
  this->delayed = this->delayed + 1;
  if ((local_50 & 1) == 0) {
    discarded = discarded + 1;
  }
  else {
    p = p + 1;
  }
  pvVar21 = (this->super_RRSolver).super_PPSolver.regions + (int)local_50;
  __end7 = std::vector<int,_std::allocator<int>_>::begin(pvVar21);
  iStack_f0 = std::vector<int,_std::allocator<int>_>::end(pvVar21);
  while (bVar7 = __gnu_cxx::operator!=(&__end7,&stack0xffffffffffffff10), bVar7) {
    piVar19 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator*(&__end7);
    local_f4 = *piVar19;
    this->region_[local_f4] = uStack_6c;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end7);
  }
  while( true ) {
    bVar7 = false;
    if (-1 < (int)local_20) {
      uVar10 = Solver::priority((Solver *)this,local_20);
      bVar7 = uVar10 == local_50;
    }
    if (!bVar7) break;
    local_20 = local_20 - 1;
  }
  goto LAB_001fd3d4;
LAB_001fd8d9:
  while( true ) {
    bVar7 = false;
    if (-1 < (int)local_20) {
      uVar10 = Solver::priority((Solver *)this,local_20);
      bVar7 = uVar10 == local_50;
    }
    if (!bVar7) break;
    local_20 = local_20 - 1;
  }
  goto LAB_001fd3d4;
}

Assistant:

void
RRDPSolver::run()
{
    // obtain highest priority and allocate arrays
    max_prio = priority(nodecount()-1);
    regions = new std::vector<int>[max_prio+1];
    region = new int[nodecount()];
    region_ = new int[nodecount()];
    strategy = new int[nodecount()];
    inverse = new int[max_prio+1];

    // initialize arrays
    for (int i=0; i<nodecount(); i++) region[i] = disabled[i] ? -2 : priority(i);
    for (int i=0; i<nodecount(); i++) region_[i] = -1;
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // start loop at last node (highest priority)
    int i = nodecount() - 1;

    // reset statistics
    promotions = 0;
    int performances = 0;

    // set to track delayed promotions
    std::vector<int> P;
    int del0 = 0, del1 = 0, discarded = 0;

    /**
     * Two loops: the outer (normal) loop, and the inner (promotion-chain) loop.
     * The outer loop does region setup and attractor on the full region.
     * The inner loop only attracts from the promoted region.
     */

    while (true) {
        // get current priority and skip all disabled/attracted nodes
        int p = i < 0 ? -1 : priority(i);
        while (i >= 0 and priority(i) == p and (disabled[i] or region[i] > p)) i--;

        if (i < 0) {
            int max = -1;
            for (int i=0; i<nodecount(); i++) if (max < region_[i]) max = region_[i];
            if (max == -1) break; // done

            if (trace) logger << "performing delayed promotions of player " << (max&1) << std::endl;
            performances++;
            for (int i=0; i<nodecount(); i++) {
                if (region[i] == -2) continue;
                if (region_[i] != -1) {
                    if ((region[i]&1) == (max&1)) {
                        region[i] = region_[i];
                        regions[region[i]].push_back(i);
                    }
                    region_[i] = -1;
                }
            }
            P.clear();
            if (trace) logger << "finished performing delayed promotions" << std::endl;
            i = inverse[max];
            promotions += (max&1) ? del1 : del0;
            discarded += (max&1) ? del0 : del1;
            del0 = del1 = 0;
            continue;
        }

        // if empty, possibly reset and continue with next
        if (priority(i) != p) {
            if (!regions[p].empty()) resetRegion(p);
            continue;
        }

        inverse[p] = i;

        // RR-DP: only reset the region if:
        // - current node is promoted or attracted
        // - or region is empty
        // - or region does not fulfill conditions
        // This is checked by checkRegion()
        if (setupRegion(i, priority(i), !checkRegion(p))) {
            // region not empty, maybe promote
            while (true) {
                if (trace >= 2) reportRegion(p);
                int res = getRegionStatus(i, p);
                if (res == -2) {
                    // not closed, skip to next priority and break inner loop
                    while (i >= 0 and priority(i) == p) i--;
                    break;
                } else if (res == -1) {
                    // found dominion
                    setDominion(p);
                    // restart algorithm and break inner loop
                    i = nodecount() - 1;
                    // reset everything... (sadly)
                    // for (int j=0; j<nodecount(); j++) region[j] = disabled[j] ? -2 : priority(j);
                    // for (int j=0; j<nodecount(); j++) strategy[j] = -1;
                    for (int j=0; j<nodecount(); j++) region_[j] = -1;
                    P.clear();
                    del0 = del1 = 0;
                    break;
                } else {
                    // check if we are locked or not
                    bool locked = false;
                    for (auto l : P) {
                        if ((l&1) != (res&1) && l < res) {
                            locked = true;
                            break;
                        }
                    }
                    if (!locked) {
                        for (int i=0; i<nodecount(); i++) {
                            if (disabled[i]) continue;
                            if (region[i] < res && res <= region_[i]) {
                                // locked for reason b
                                locked = true;
                                break;
                            }
                        }
                    }
                    if (locked) {
                        // found delayed promotion
                        if (trace >= 2) {
                            logger << "\033[1;33mdelayed \033[36m" << p << " \033[37mto \033[36m" << res << "\033[m:";
                            for (int n : regions[p]) {
                                logger << " \033[37m" << label_vertex(n) << "\033[m";
                            }
                            logger << std::endl;
                        } else if (trace) {
                            logger << "\033[1;33mdelayed \033[36m" << p << " \033[37mto \033[36m" << res << "\033[m" << std::endl;
                        }
                        delayed++;
                        if (p&1) del1++;
                        else del0++;
                        // emulate delayed promotion in region_
                        for (int i : regions[p]) region_[i] = res;
                        // skip to next priority and break inner loop
                        while (i >= 0 and priority(i) == p) i--;
                        break;
                    } else {
                        // found promotion, perform it
                        promote(p, res);
                        // add promotion to P
                        P.erase(std::remove(P.begin(), P.end(), p), P.end());
                        P.push_back(res);
                        // remove from region_ below res
                        for (int i=0; i<nodecount(); i++) if (region[i] != 2 && region_[i] <= res) region_[i] = -1;
                        // continue loop with higher priority
                        i = inverse[res];
                        p = res;
                    }
                }
            }
        } else {
            // skip to next priority
            while (i >= 0 and priority(i) == p) i--;
        }
    }

    delete[] regions;
    delete[] region;
    delete[] region_;
    delete[] strategy;
    delete[] inverse;

    logger << "solved with " << promotions << " promotions, " << performances << "x performing delayed promotions (delayed " << delayed << ", discarded " << discarded << ", total " << promotions+discarded << ")" << std::endl;
}